

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O0

void __thiscall
llama_kv_cache_unified::seq_add
          (llama_kv_cache_unified *this,llama_seq_id seq_id,llama_pos p0,llama_pos p1,
          llama_pos delta)

{
  bool bVar1;
  reference pvVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  llama_seq_id *in_RDI;
  int in_R8D;
  uint32_t i;
  llama_kv_cell *cell;
  int32_t tail_id;
  uint32_t new_head;
  uint local_44;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar3;
  uint local_1c;
  int local_14;
  int local_10;
  
  if (in_R8D != 0) {
    local_1c = in_RDI[0x1b];
    local_10 = in_EDX;
    if (in_EDX < 0) {
      local_10 = 0;
    }
    local_14 = in_ECX;
    if (in_ECX < 0) {
      local_14 = std::numeric_limits<int>::max();
    }
    if (local_10 != local_14) {
      if ((*(byte *)((long)in_RDI + 0x62) & 1) == 0) {
        for (uVar3 = 0; uVar3 < (uint)in_RDI[0x1b]; uVar3 = uVar3 + 1) {
          std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                    ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(in_RDI + 0x1e),
                     (ulong)uVar3);
          bVar1 = llama_kv_cell::has_seq_id
                            ((llama_kv_cell *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),in_RDI);
          if (((bVar1) &&
              (pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                                  ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                   (in_RDI + 0x1e),(ulong)uVar3), local_10 <= pvVar2->pos)) &&
             (pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                                 ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                  (in_RDI + 0x1e),(ulong)uVar3), pvVar2->pos < local_14)) {
            *(undefined1 *)(in_RDI + 0x18) = 1;
            pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                               ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                (in_RDI + 0x1e),(ulong)uVar3);
            pvVar2->pos = in_R8D + pvVar2->pos;
            pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                               ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                (in_RDI + 0x1e),(ulong)uVar3);
            pvVar2->delta = in_R8D + pvVar2->delta;
            pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                               ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                (in_RDI + 0x1e),(ulong)uVar3);
            if (pvVar2->pos < 0) {
              std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                        ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(in_RDI + 0x1e),
                         (ulong)uVar3);
              bVar1 = llama_kv_cell::is_empty((llama_kv_cell *)0x441660);
              if (!bVar1) {
                in_RDI[0x1c] = in_RDI[0x1c] + -1;
              }
              pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                                 ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                  (in_RDI + 0x1e),(ulong)uVar3);
              pvVar2->pos = -1;
              std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                        ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(in_RDI + 0x1e),
                         (ulong)uVar3);
              std::set<int,_std::less<int>,_std::allocator<int>_>::clear
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)0x4416ac);
              if (local_1c == in_RDI[0x1b]) {
                local_1c = uVar3;
              }
            }
          }
        }
        if (local_1c == in_RDI[0x1b]) {
          local_44 = 0;
        }
        else {
          local_44 = local_1c;
        }
        in_RDI[0x1a] = local_44;
      }
      else if ((-1 < in_ESI) && ((long)in_ESI < (long)(ulong)(uint)in_RDI[0x1b])) {
        pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                           ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(in_RDI + 0x1e)
                            ,(long)in_ESI);
        if (-1 < pvVar2->tail) {
          pvVar2 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                             ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                              (in_RDI + 0x1e),(long)pvVar2->tail);
          bVar1 = llama_kv_cell::has_seq_id
                            ((llama_kv_cell *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
          if (((bVar1) && (local_10 <= pvVar2->pos)) && (pvVar2->pos < local_14)) {
            pvVar2->pos = in_R8D + pvVar2->pos;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void llama_kv_cache_unified::seq_add(llama_seq_id seq_id, llama_pos p0, llama_pos p1, llama_pos delta) {
    if (delta == 0) {
        return;
    }

    uint32_t new_head = size;

    if (p0 < 0) {
        p0 = 0;
    }

    if (p1 < 0) {
        p1 = std::numeric_limits<llama_pos>::max();
    }

    // If there is no range then return early to avoid looping over the
    if (p0 == p1) {
        return;
    }

    if (recurrent) {
        // for Mamba-like or RWKV models, only the pos needs to be shifted
        if (0 <= seq_id && seq_id < (int64_t) size) {
            const int32_t tail_id = cells[seq_id].tail;
            if (tail_id >= 0) {
                llama_kv_cell & cell = cells[tail_id];
                if (cell.has_seq_id(seq_id) && p0 <= cell.pos && cell.pos < p1) {
                    cell.pos += delta;
                }
            }
        }
        return;
    }

    for (uint32_t i = 0; i < size; ++i) {
        if (cells[i].has_seq_id(seq_id) && cells[i].pos >= p0 && cells[i].pos < p1) {
            has_shift = true;
            cells[i].pos   += delta;
            cells[i].delta += delta;

            if (cells[i].pos < 0) {
                if (!cells[i].is_empty()) {
                    used--;
                }
                cells[i].pos = -1;
                cells[i].seq_id.clear();
                if (new_head == size) {
                    new_head = i;
                }
            }
        }
    }

    // If we freed up a slot, set head to it so searching can start there.
    // Otherwise we just start the next search from the beginning.
    head = new_head != size ? new_head : 0;
}